

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

void block_readpipe(int pipefd,void *buffer,int sz)

{
  ssize_t sVar1;
  int *piVar2;
  
  do {
    sVar1 = read(pipefd,buffer,(ulong)(uint)sz);
    if (-1 < (int)sVar1) {
      if ((int)sVar1 == sz) {
        return;
      }
      __assert_fail("n == sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                    ,0x366,"void block_readpipe(int, void *, int)");
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  block_readpipe_cold_1();
  return;
}

Assistant:

static void
block_readpipe(int pipefd, void *buffer, int sz) {
	for (;;) {
		int n = read(pipefd, buffer, sz);
		if (n<0) {
			if (errno == EINTR)
				continue;
			fprintf(stderr, "socket-server : read pipe error %s.\n",strerror(errno));
			return;
		}
		// must atomic read from a pipe
		assert(n == sz);
		return;
	}
}